

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score_test.cc
# Opt level: O3

void __thiscall xLearn::FMScoreTest_calc_score_Test::TestBody(FMScoreTest_calc_score_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  index_t iVar18;
  index_t iVar19;
  bool bVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  char *message;
  uint uVar24;
  ulong uVar25;
  index_t iVar26;
  real_t *prVar27;
  long lVar28;
  ushort uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  real_t expected;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined4 in_XMM12_Da;
  undefined1 in_register_00001504 [12];
  SparseRow row;
  AssertionResult gtest_ar;
  Model model;
  FMScore score;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  long local_380;
  undefined1 local_378 [16];
  pointer local_368;
  internal local_358 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  _func_int **local_348;
  ulong local_340;
  size_t local_338;
  AssertHelper local_330;
  Model local_328;
  FMScore local_298;
  HyperParam local_240;
  
  uVar25 = 1;
  local_348 = (_func_int **)&PTR__Score_0014f448;
  do {
    HyperParam::HyperParam(&local_240);
    local_240._148_8_ = SUB648(ZEXT464(0x3dcccccd),0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_240.loss_func,0,(char *)local_240.loss_func._M_string_length,0x13e2a7);
    std::__cxx11::string::_M_replace
              ((ulong)&local_240.score_func,0,(char *)local_240.score_func._M_string_length,0x13e79a
              );
    local_368 = (pointer)0x0;
    local_240.num_feature = 3;
    local_240.num_K = (index_t)uVar25;
    local_240.num_field = 3;
    local_378 = (undefined1  [16])0x0;
    local_378._0_8_ = operator_new(0x24);
    auVar42._8_4_ = 0x40000000;
    auVar42._0_8_ = 0x4000000040000000;
    auVar42._12_4_ = 0x40000000;
    auVar42._16_4_ = 0x40000000;
    auVar42._20_4_ = 0x40000000;
    auVar42._24_4_ = 0x40000000;
    auVar42._28_4_ = 0x40000000;
    auVar31 = vpbroadcastq_avx512f(ZEXT816(0xc));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar33 = vpbroadcastd_avx512f(ZEXT416(0x10));
    local_368 = (pointer)(local_378._0_8_ + 0x24);
    local_378._8_8_ = local_368;
    if ((ulong)local_240.num_feature != 0) {
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbd_avx512f(_DAT_0013e250);
      auVar37 = vpbroadcastq_avx512f();
      uVar22 = (ulong)local_240.num_feature + 0xf & 0x1fffffff0;
      auVar38 = vpbroadcastq_avx512f();
      do {
        auVar39 = vpmullq_avx512dq(auVar34,auVar31);
        auVar40 = vpmullq_avx512dq(auVar35,auVar31);
        uVar15 = vpcmpuq_avx512f(auVar34,auVar38,2);
        uVar16 = vpcmpuq_avx512f(auVar35,auVar38,2);
        auVar30 = vextracti64x4_avx512f(auVar36,1);
        auVar34 = vpaddq_avx512f(auVar34,auVar32);
        auVar35 = vpaddq_avx512f(auVar35,auVar32);
        uVar22 = uVar22 - 0x10;
        auVar39 = vpaddq_avx512f(auVar37,auVar39);
        auVar40 = vpaddq_avx512f(auVar37,auVar40);
        vpscatterqd_avx512f(ZEXT832(4) + auVar39._0_32_,uVar15,auVar36._0_32_);
        auVar36 = vpaddd_avx512f(auVar36,auVar33);
        vpscatterqd_avx512f(ZEXT832(4) + auVar40._0_32_,uVar16,auVar30);
        vscatterqps_avx512f(ZEXT864(8) + auVar39,uVar15,auVar42);
        vscatterqps_avx512f(ZEXT864(8) + auVar40,uVar16,auVar42);
      } while (uVar22 != 0);
    }
    local_328.score_func_._M_dataplus._M_p = (pointer)&local_328.score_func_.field_2;
    local_328.loss_func_._M_dataplus._M_p = (pointer)&local_328.loss_func_.field_2;
    local_328.score_func_._M_string_length = 0;
    local_328.score_func_.field_2._M_local_buf[0] = '\0';
    local_328.loss_func_._M_string_length = 0;
    local_328.loss_func_.field_2._M_local_buf[0] = '\0';
    local_328.param_best_v_ = (real_t *)0x0;
    local_328.param_best_b_ = (real_t *)0x0;
    local_328.param_w_ = (real_t *)0x0;
    local_328.param_v_ = (real_t *)0x0;
    local_328.param_b_ = (real_t *)0x0;
    local_328.param_best_w_ = (real_t *)0x0;
    Model::Initialize(&local_328,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                      local_240.num_field,local_240.num_K,2,1.0);
    iVar19 = local_328.num_K_;
    iVar18 = local_328.num_feat_;
    auVar31 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    if ((ulong)local_328.param_num_w_ != 0) {
      auVar34 = vpbroadcastq_avx512f();
      uVar22 = 0;
      do {
        auVar35 = vpbroadcastq_avx512f();
        auVar36 = vporq_avx512f(auVar35,auVar32);
        auVar35 = vporq_avx512f(auVar35,auVar33);
        uVar15 = vpcmpuq_avx512f(auVar35,auVar34,2);
        uVar16 = vpcmpuq_avx512f(auVar36,auVar34,2);
        bVar17 = (byte)uVar16;
        uVar29 = CONCAT11(bVar17,(byte)uVar15);
        prVar27 = local_328.param_w_ + uVar22;
        bVar20 = (bool)((byte)uVar15 & 1);
        bVar2 = (bool)((byte)(uVar29 >> 1) & 1);
        bVar3 = (bool)((byte)(uVar29 >> 2) & 1);
        bVar4 = (bool)((byte)(uVar29 >> 3) & 1);
        bVar5 = (bool)((byte)(uVar29 >> 4) & 1);
        bVar6 = (bool)((byte)(uVar29 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar29 >> 6) & 1);
        bVar8 = (bool)((byte)(uVar29 >> 7) & 1);
        bVar9 = (bool)(bVar17 >> 1 & 1);
        bVar10 = (bool)(bVar17 >> 2 & 1);
        bVar11 = (bool)(bVar17 >> 3 & 1);
        bVar12 = (bool)(bVar17 >> 4 & 1);
        bVar13 = (bool)(bVar17 >> 5 & 1);
        bVar14 = (bool)(bVar17 >> 6 & 1);
        *prVar27 = (real_t)((uint)bVar20 * auVar31._0_4_ | (uint)!bVar20 * (int)*prVar27);
        prVar27[1] = (real_t)((uint)bVar2 * auVar31._4_4_ | (uint)!bVar2 * (int)prVar27[1]);
        prVar27[2] = (real_t)((uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * (int)prVar27[2]);
        prVar27[3] = (real_t)((uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * (int)prVar27[3]);
        prVar27[4] = (real_t)((uint)bVar5 * auVar31._16_4_ | (uint)!bVar5 * (int)prVar27[4]);
        prVar27[5] = (real_t)((uint)bVar6 * auVar31._20_4_ | (uint)!bVar6 * (int)prVar27[5]);
        prVar27[6] = (real_t)((uint)bVar7 * auVar31._24_4_ | (uint)!bVar7 * (int)prVar27[6]);
        prVar27[7] = (real_t)((uint)bVar8 * auVar31._28_4_ | (uint)!bVar8 * (int)prVar27[7]);
        prVar27[8] = (real_t)((uint)(bVar17 & 1) * auVar31._32_4_ |
                             (uint)!(bool)(bVar17 & 1) * (int)prVar27[8]);
        prVar27[9] = (real_t)((uint)bVar9 * auVar31._36_4_ | (uint)!bVar9 * (int)prVar27[9]);
        prVar27[10] = (real_t)((uint)bVar10 * auVar31._40_4_ | (uint)!bVar10 * (int)prVar27[10]);
        prVar27[0xb] = (real_t)((uint)bVar11 * auVar31._44_4_ | (uint)!bVar11 * (int)prVar27[0xb]);
        prVar27[0xc] = (real_t)((uint)bVar12 * auVar31._48_4_ | (uint)!bVar12 * (int)prVar27[0xc]);
        prVar27[0xd] = (real_t)((uint)bVar13 * auVar31._52_4_ | (uint)!bVar13 * (int)prVar27[0xd]);
        prVar27[0xe] = (real_t)((uint)bVar14 * auVar31._56_4_ | (uint)!bVar14 * (int)prVar27[0xe]);
        prVar27[0xf] = (real_t)((uint)(bVar17 >> 7) * auVar31._60_4_ |
                               (uint)!(bool)(bVar17 >> 7) * (int)prVar27[0xf]);
        uVar22 = uVar22 + 0x10;
      } while (((ulong)local_328.param_num_w_ + 0xf & 0x1fffffff0) != uVar22);
    }
    auVar41._4_12_ = in_register_00001504;
    auVar41._0_4_ = in_XMM12_Da;
    auVar41 = vcvtusi2ss_avx512f(auVar41,local_328.num_K_);
    local_340 = uVar25;
    if (local_328.num_feat_ != 0) {
      auVar41 = ZEXT416((uint)(auVar41._0_4_ * 0.25));
      auVar41 = vroundss_avx(auVar41,auVar41,10);
      iVar26 = 0;
      iVar23 = vcvttss2usi_avx512f(auVar41);
      uVar24 = iVar23 * 4;
      local_338 = (ulong)(~local_328.num_K_ + uVar24) * 4 + 4;
      local_380 = (ulong)(~local_328.num_K_ + uVar24) << 2;
      prVar27 = local_328.param_v_;
      uVar21 = iVar19;
      do {
        for (; uVar21 != 0; uVar21 = uVar21 - 1) {
          *prVar27 = 1.0;
          prVar27 = prVar27 + 1;
        }
        if (iVar19 < uVar24) {
          memset(prVar27,0,local_338);
          prVar27 = (real_t *)((long)prVar27 + local_380 + 4);
        }
        uVar21 = uVar24;
        if (uVar24 < (uint)(iVar23 << 3)) {
          do {
            *prVar27 = 1.0;
            prVar27 = prVar27 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        iVar26 = iVar26 + 1;
        uVar21 = iVar19;
      } while (iVar26 != iVar18);
    }
    paVar1 = &local_298.super_Score.opt_type_.field_2;
    lVar28 = 10;
    *local_328.param_b_ = 0.0;
    iVar23 = (int)local_340;
    local_298.super_Score.opt_type_._M_string_length = 0;
    local_298.super_Score.opt_type_.field_2._M_local_buf[0] = '\0';
    local_298.super_Score._vptr_Score = local_348;
    local_298.comp_res = (real_t *)0x0;
    local_298.comp_z_lt_zero = (real_t *)0x0;
    local_298.comp_z_gt_zero = (real_t *)0x0;
    local_380 = CONCAT44(local_380._4_4_,(float)(iVar23 * 0xc + 6));
    local_298.super_Score.opt_type_._M_dataplus._M_p = (pointer)paVar1;
    do {
      expected = FMScore::CalcScore(&local_298,(SparseRow *)local_378,&local_328,1.0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_358,"val","6+k*4*3",expected,(float)local_380);
      if (local_358[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_388);
        message = "";
        if (local_350.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_350.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/fm_score_test.cc"
                   ,0x4a,message);
        testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_388);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        if (((local_388.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar20 = testing::internal::IsTrue(true), bVar20)) &&
           (local_388.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_388.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
    local_298.super_Score._vptr_Score = (_func_int **)&PTR__Score_0014f3c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.super_Score.opt_type_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.super_Score.opt_type_._M_dataplus._M_p);
    }
    Model::~Model(&local_328);
    if ((pointer)local_378._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_378._0_8_);
    }
    HyperParam::~HyperParam(&local_240);
    uVar24 = iVar23 + 1;
    uVar25 = (ulong)uVar24;
  } while (uVar24 != 100);
  return;
}

Assistant:

TEST(FMScoreTest, calc_score) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "fm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature);
    for (index_t i = 0; i < param.num_feature; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for(index_t d = 0; d < model.GetNumK(); d++, v++)
        *v = 1.0;
      for(index_t d = model.GetNumK(); d < k_aligned; d++, v++)
        *v = 0;
      for(index_t d = k_aligned; d < 2*k_aligned; d++, v++)
        *v = 1.0;
    }
    model.GetParameter_b()[0] = 0.0;
    FMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}